

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::ResolveComplexJoin
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *input,
          DataChunk *chunk,OperatorState *state_p)

{
  bool bVar1;
  pointer pJVar2;
  pointer pJVar3;
  idx_t iVar4;
  idx_t iVar5;
  __int_type _Var6;
  __int_type _Var7;
  size_t size;
  OuterJoinMarker *pOVar8;
  int iVar9;
  pointer pGVar10;
  pointer pGVar11;
  reference pvVar12;
  type state;
  reference pvVar13;
  type pRVar14;
  const_reference pvVar15;
  data_ptr_t pdVar16;
  data_ptr_t str1;
  reference pvVar17;
  reference other;
  SelectionVector *sel_vector;
  ulong uVar18;
  pointer pRVar19;
  _func_int **pp_Var20;
  ulong *puVar21;
  idx_t c;
  _func_int **pp_Var22;
  ulong uVar23;
  ulong result_count;
  _func_int **pp_Var24;
  bool external;
  DataChunk *local_2b0;
  data_ptr_t l_ptr;
  DataChunk *local_2a0;
  type local_298;
  OuterJoinMarker *local_290;
  pointer local_288;
  data_ptr_t local_280;
  int local_274;
  idx_t local_270;
  OperatorState *local_268;
  DataChunk *local_260;
  vector<duckdb::JoinCondition,_true> *local_258;
  type local_250;
  SelectionVector *local_248;
  DataChunk *local_240;
  BlockMergeInfo right_info;
  BlockMergeInfo left_info;
  SBScanState lread;
  SBScanState rread;
  
  local_2b0 = chunk;
  pGVar10 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
            ::operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                          super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                          sink_state);
  pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                          *)(pGVar10 + 1));
  pvVar12 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::get<true>(&(pGVar11->global_sort_state).sorted_blocks,0);
  local_298 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator*(pvVar12);
  local_270 = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68;
  local_258 = &(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions;
  pJVar2 = *(pointer *)
            ((long)&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data + 8);
  pJVar3 = (this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_start;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::clear
            ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)(state_p + 0x46)
            );
  local_268 = state_p + 0x26;
  local_240 = (DataChunk *)(state_p + 8);
  local_2a0 = (DataChunk *)(state_p + 0x35);
  local_260 = (DataChunk *)(state_p + 0x2d);
  local_248 = (SelectionVector *)(state_p + 0x2a);
  local_290 = (OuterJoinMarker *)(state_p + 0x10);
  local_288 = pGVar10 + 1;
  do {
    pGVar10 = local_288;
    pOVar8 = local_290;
    if (*(char *)&state_p[0x25]._vptr_OperatorState == '\x01') {
      PiecewiseMergeJoinState::ResolveJoinKeys((PiecewiseMergeJoinState *)state_p,input);
      state_p[0x24]._vptr_OperatorState = (_func_int **)0x0;
      *(undefined2 *)&state_p[0x25]._vptr_OperatorState = 0;
      local_268[2]._vptr_OperatorState = (_func_int **)0x0;
      local_268[3]._vptr_OperatorState = (_func_int **)0x0;
      local_268->_vptr_OperatorState = (_func_int **)0x0;
      local_268[1]._vptr_OperatorState = (_func_int **)0x0;
    }
    else if (((ulong)state_p[0x25]._vptr_OperatorState & 0x100) != 0) {
      if ((local_290->enabled == true) &&
         (OuterJoinMarker::ConstructLeftJoinResult(local_290,local_240,local_2b0),
         pOVar8->enabled == true)) {
        switchD_014c3389::default
                  (state_p[0x11]._vptr_OperatorState,0,(size_t)state_p[0x12]._vptr_OperatorState);
      }
      *(undefined2 *)&state_p[0x25]._vptr_OperatorState = 1;
      return NEED_MORE_INPUT;
    }
    local_250 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                ::operator*((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                             *)(state_p + 0x21));
    iVar4 = local_250->count;
    iVar5 = local_250->has_null;
    state = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
            ::operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                         *)(state_p + 0x22));
    BlockMergeInfo::BlockMergeInfo(&left_info,state,0,(idx_t *)(state_p + 0x24),iVar4 - iVar5);
    pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
              ::get<true>(&local_298->radix_sorting_data,
                          (size_type)state_p[0x27]._vptr_OperatorState);
    pRVar14 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
              operator*(pvVar13);
    pp_Var20 = state_p[0x28]._vptr_OperatorState;
    iVar4 = pRVar14->count;
    pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)pGVar10);
    _Var6 = (pGVar11->count).super___atomic_base<unsigned_long>._M_i;
    pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)pGVar10);
    _Var7 = (pGVar11->has_null).super___atomic_base<unsigned_long>._M_i;
    pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)pGVar10);
    pp_Var24 = (_func_int **)(iVar4 + (long)pp_Var20);
    pp_Var22 = (_func_int **)(_Var6 - _Var7);
    if (pp_Var22 < pp_Var20) {
      pp_Var22 = pp_Var20;
    }
    if (pp_Var24 < pp_Var22) {
      pp_Var22 = pp_Var24;
    }
    BlockMergeInfo::BlockMergeInfo
              (&right_info,&pGVar11->global_sort_state,(idx_t)state_p[0x27]._vptr_OperatorState,
               (idx_t *)local_268,(long)pp_Var22 - (long)pp_Var20);
    pvVar15 = vector<duckdb::JoinCondition,_true>::get<true>(local_258,0);
    local_274 = MergeJoinComparisonValue(pvVar15->comparison);
    bVar1 = ((right_info.state)->sort_layout).all_constant;
    external = (left_info.state)->external;
    SBScanState::SBScanState(&lread,(left_info.state)->buffer_manager,left_info.state);
    pvVar12 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::get<true>(&(left_info.state)->sorted_blocks,0);
    lread.sb = (pvVar12->
               super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
               _M_t.
               super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
               .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
    MergeJoinPinSortingBlock(&lread,left_info.block_idx);
    lread.entry_idx = 0;
    pdVar16 = SBScanState::RadixPtr(&lread);
    lread.entry_idx = *left_info.entry_idx;
    str1 = SBScanState::RadixPtr(&lread);
    l_ptr = str1;
    SBScanState::SBScanState(&rread,(right_info.state)->buffer_manager,right_info.state);
    pvVar12 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::get<true>(&(right_info.state)->sorted_blocks,0);
    rread.sb = (pvVar12->
               super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
               _M_t.
               super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
               .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
    if (*right_info.entry_idx < right_info.not_null) {
      MergeJoinPinSortingBlock(&rread,right_info.block_idx);
      rread.entry_idx = *right_info.entry_idx;
      local_280 = SBScanState::RadixPtr(&rread);
      size = ((left_info.state)->sort_layout).comparison_size;
      iVar4 = ((left_info.state)->sort_layout).entry_size;
      result_count = 0;
      puVar21 = left_info.entry_idx;
      do {
        pp_Var20 = (_func_int **)*puVar21;
        while (state_p[0x29]._vptr_OperatorState <= pp_Var20) {
          if (pp_Var20 < left_info.not_null) {
            if (bVar1 == false) {
              rread.entry_idx = *right_info.entry_idx;
              lread.entry_idx = (idx_t)pp_Var20;
              iVar9 = Comparators::CompareTuple
                                (&lread,&rread,&l_ptr,&local_280,&(left_info.state)->sort_layout,
                                 &external);
            }
            else {
              iVar9 = FastMemcmp(str1,local_280,size);
            }
            pp_Var20 = (_func_int **)*left_info.entry_idx;
            puVar21 = left_info.entry_idx;
            if (iVar9 <= local_274) {
              left_info.result.sel_vector[result_count] = (sel_t)pp_Var20;
              right_info.result.sel_vector[result_count] = (sel_t)*right_info.entry_idx;
              *left_info.entry_idx = (long)pp_Var20 + 1;
              str1 = l_ptr;
              goto LAB_019dfb7e;
            }
          }
          state_p[0x29]._vptr_OperatorState = pp_Var20;
          iVar5 = *right_info.entry_idx;
          *right_info.entry_idx = iVar5 + 1;
          if (right_info.not_null <= iVar5 + 1) goto LAB_019dfba4;
          local_280 = local_280 + iVar4;
          *puVar21 = 0;
          str1 = pdVar16;
          l_ptr = pdVar16;
          pp_Var20 = (_func_int **)0x0;
        }
        left_info.result.sel_vector[result_count] = (sel_t)pp_Var20;
        right_info.result.sel_vector[result_count] = (sel_t)*right_info.entry_idx;
        *puVar21 = (long)pp_Var20 + 1;
LAB_019dfb7e:
        result_count = result_count + 1;
        str1 = str1 + iVar4;
        l_ptr = str1;
      } while (result_count != 0x800);
      result_count = 0x800;
    }
    else {
      result_count = 0;
    }
LAB_019dfba4:
    SBScanState::~SBScanState(&rread);
    SBScanState::~SBScanState(&lread);
    if (result_count == 0) {
      state_p[0x24]._vptr_OperatorState = (_func_int **)0x0;
      state_p[0x26]._vptr_OperatorState = (_func_int **)0x0;
      pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::get<true>(&local_298->radix_sorting_data,
                            (size_type)state_p[0x27]._vptr_OperatorState);
      pRVar19 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar13);
      state_p[0x28]._vptr_OperatorState =
           (_func_int **)((long)state_p[0x28]._vptr_OperatorState + pRVar19->count);
      pp_Var20 = (_func_int **)((long)state_p[0x27]._vptr_OperatorState + 1);
      state_p[0x27]._vptr_OperatorState = pp_Var20;
      if ((_func_int **)
          ((long)(local_298->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_298->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) <= pp_Var20) {
        *(undefined1 *)((long)&state_p[0x25]._vptr_OperatorState + 1) = 1;
      }
    }
    else {
      DataChunk::Reset(local_2b0);
      for (uVar23 = 0;
          uVar23 < (ulong)(((long)state_p[9]._vptr_OperatorState -
                           (long)state_p[8]._vptr_OperatorState) / 0x68); uVar23 = uVar23 + 1) {
        pvVar17 = vector<duckdb::Vector,_true>::get<true>(&local_2b0->data,uVar23);
        other = vector<duckdb::Vector,_true>::get<true>(&local_240->data,uVar23);
        Vector::Slice(pvVar17,other,&left_info.result,result_count);
      }
      PhysicalRangeJoin::SliceSortedPayload
                ((BufferHandle *)&lread,local_2b0,right_info.state,right_info.block_idx,
                 &right_info.result,result_count,local_270);
      ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
      emplace_back<duckdb::BufferHandle>
                ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                 (state_p + 0x46),(BufferHandle *)&lread);
      BufferHandle::~BufferHandle((BufferHandle *)&lread);
      local_2b0->count = result_count;
      sel_vector = FlatVector::IncrementalSelectionVector();
      if ((long)pJVar2 - (long)pJVar3 != 0x18) {
        DataChunk::Split(local_2b0,local_2a0,local_270);
        state_p[0x40]._vptr_OperatorState = (_func_int **)local_2a0;
        DataChunk::Reset(local_260);
        local_250 = (type)&local_250->keys;
        uVar18 = result_count;
        for (uVar23 = 1;
            uVar23 < (ulong)(((long)*(pointer *)
                                     ((long)&(this->super_PhysicalRangeJoin).
                                             super_PhysicalComparisonJoin.conditions.
                                             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                             .
                                             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                             (long)(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                                   conditions.
                                   super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                   .
                                   super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
            uVar23 = uVar23 + 1) {
          pvVar17 = vector<duckdb::Vector,_true>::get<true>
                              ((vector<duckdb::Vector,_true> *)local_250,uVar23);
          Vector::Vector((Vector *)&lread,pvVar17);
          Vector::Slice((Vector *)&lread,&left_info.result,result_count);
          pvVar17 = vector<duckdb::Vector,_true>::get<true>(&local_260->data,uVar23);
          ExpressionExecutor::ExecuteExpression
                    ((ExpressionExecutor *)(state_p + 0x3d),uVar23,pvVar17);
          if (uVar18 < result_count) {
            Vector::Slice((Vector *)&lread,sel_vector,uVar18);
            Vector::Slice(pvVar17,sel_vector,uVar18);
          }
          pvVar15 = vector<duckdb::JoinCondition,_true>::get<true>(local_258,uVar23);
          uVar18 = PhysicalRangeJoin::SelectJoinTail
                             (&pvVar15->comparison,(Vector *)&lread,pvVar17,sel_vector,uVar18,
                              local_248);
          Vector::~Vector((Vector *)&lread);
          sel_vector = local_248;
        }
        DataChunk::Fuse(local_2b0,local_2a0);
        if (uVar18 < result_count) {
          if (uVar18 == 0) {
            DataChunk::Reset(local_2b0);
            result_count = 0;
          }
          else {
            DataChunk::Slice(local_2b0,sel_vector,uVar18);
            result_count = uVar18;
          }
        }
      }
      if (local_290->enabled == true) {
        for (uVar23 = 0; result_count != uVar23; uVar23 = uVar23 + 1) {
          uVar18 = uVar23;
          if (sel_vector->sel_vector != (sel_t *)0x0) {
            uVar18 = (ulong)sel_vector->sel_vector[uVar23];
          }
          if (local_290->enabled == true) {
            *(undefined1 *)
             ((long)state_p[0x11]._vptr_OperatorState + (ulong)left_info.result.sel_vector[uVar18])
                 = 1;
          }
        }
      }
      pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                              *)local_288);
      if ((pGVar11->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl != (bool *)0x0) {
        for (uVar23 = 0; result_count != uVar23; uVar23 = uVar23 + 1) {
          pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                                  *)local_288);
          uVar18 = uVar23;
          if (sel_vector->sel_vector != (sel_t *)0x0) {
            uVar18 = (ulong)sel_vector->sel_vector[uVar23];
          }
          *(bool *)((long)state_p[0x28]._vptr_OperatorState +
                   (long)((pGVar11->found_match).
                          super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                          super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                         right_info.result.sel_vector[uVar18])) = true;
        }
      }
      local_2b0->count = result_count;
      DataChunk::Verify(local_2b0);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&right_info.result.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&left_info.result.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (local_2b0->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
  } while( true );
}

Assistant:

OperatorResultType PhysicalPiecewiseMergeJoin::ResolveComplexJoin(ExecutionContext &context, DataChunk &input,
                                                                  DataChunk &chunk, OperatorState &state_p) const {
	auto &state = state_p.Cast<PiecewiseMergeJoinState>();
	auto &gstate = sink_state->Cast<MergeJoinGlobalState>();
	auto &rsorted = *gstate.table->global_sort_state.sorted_blocks[0];
	const auto left_cols = input.ColumnCount();
	const auto tail_cols = conditions.size() - 1;

	state.payload_heap_handles.clear();
	do {
		if (state.first_fetch) {
			state.ResolveJoinKeys(input);

			state.right_chunk_index = 0;
			state.right_base = 0;
			state.left_position = 0;
			state.prev_left_index = 0;
			state.right_position = 0;
			state.first_fetch = false;
			state.finished = false;
		}
		if (state.finished) {
			if (state.left_outer.Enabled()) {
				// left join: before we move to the next chunk, see if we need to output any vectors that didn't
				// have a match found
				state.left_outer.ConstructLeftJoinResult(state.lhs_payload, chunk);
				state.left_outer.Reset();
			}
			state.first_fetch = true;
			state.finished = false;
			return OperatorResultType::NEED_MORE_INPUT;
		}

		auto &lhs_table = *state.lhs_local_table;
		const auto lhs_not_null = lhs_table.count - lhs_table.has_null;
		BlockMergeInfo left_info(*state.lhs_global_state, 0, state.left_position, lhs_not_null);

		const auto &rblock = *rsorted.radix_sorting_data[state.right_chunk_index];
		const auto rhs_not_null =
		    SortedBlockNotNull(state.right_base, rblock.count, gstate.table->count - gstate.table->has_null);
		BlockMergeInfo right_info(gstate.table->global_sort_state, state.right_chunk_index, state.right_position,
		                          rhs_not_null);

		idx_t result_count =
		    MergeJoinComplexBlocks(left_info, right_info, conditions[0].comparison, state.prev_left_index);
		if (result_count == 0) {
			// exhausted this chunk on the right side
			// move to the next right chunk
			state.left_position = 0;
			state.right_position = 0;
			state.right_base += rsorted.radix_sorting_data[state.right_chunk_index]->count;
			state.right_chunk_index++;
			if (state.right_chunk_index >= rsorted.radix_sorting_data.size()) {
				state.finished = true;
			}
		} else {
			// found matches: extract them
			chunk.Reset();
			for (idx_t c = 0; c < state.lhs_payload.ColumnCount(); ++c) {
				chunk.data[c].Slice(state.lhs_payload.data[c], left_info.result, result_count);
			}
			state.payload_heap_handles.push_back(SliceSortedPayload(chunk, right_info.state, right_info.block_idx,
			                                                        right_info.result, result_count, left_cols));
			chunk.SetCardinality(result_count);

			auto sel = FlatVector::IncrementalSelectionVector();
			if (tail_cols) {
				// If there are more expressions to compute,
				// split the result chunk into the left and right halves
				// so we can compute the values for comparison.
				chunk.Split(state.rhs_input, left_cols);
				state.rhs_executor.SetChunk(state.rhs_input);
				state.rhs_keys.Reset();

				auto tail_count = result_count;
				for (size_t cmp_idx = 1; cmp_idx < conditions.size(); ++cmp_idx) {
					Vector left(lhs_table.keys.data[cmp_idx]);
					left.Slice(left_info.result, result_count);

					auto &right = state.rhs_keys.data[cmp_idx];
					state.rhs_executor.ExecuteExpression(cmp_idx, right);

					if (tail_count < result_count) {
						left.Slice(*sel, tail_count);
						right.Slice(*sel, tail_count);
					}
					tail_count =
					    SelectJoinTail(conditions[cmp_idx].comparison, left, right, sel, tail_count, &state.sel);
					sel = &state.sel;
				}
				chunk.Fuse(state.rhs_input);

				if (tail_count < result_count) {
					result_count = tail_count;
					if (result_count == 0) {
						// Need to reset here otherwise we may use the non-flat chunk when constructing LEFT/OUTER
						chunk.Reset();
					} else {
						chunk.Slice(*sel, result_count);
					}
				}
			}

			// found matches: mark the found matches if required
			if (state.left_outer.Enabled()) {
				for (idx_t i = 0; i < result_count; i++) {
					state.left_outer.SetMatch(left_info.result[sel->get_index(i)]);
				}
			}
			if (gstate.table->found_match) {
				//	Absolute position of the block + start position inside that block
				for (idx_t i = 0; i < result_count; i++) {
					gstate.table->found_match[state.right_base + right_info.result[sel->get_index(i)]] = true;
				}
			}
			chunk.SetCardinality(result_count);
			chunk.Verify();
		}
	} while (chunk.size() == 0);
	return OperatorResultType::HAVE_MORE_OUTPUT;
}